

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyCoerceNode(TidyDocImpl *doc,Node *node,TidyTagId tid,Bool obsolete,Bool unexpected)

{
  Dict *pDVar1;
  Node *node_00;
  tmbstr ptVar2;
  uint code;
  
  pDVar1 = prvTidyLookupTagDef(tid);
  node_00 = prvTidyInferredTag(doc,pDVar1->id);
  code = 0x269;
  if (obsolete == no) {
    code = 0x274 - (unexpected == no);
  }
  prvTidyReport(doc,node,node_00,code);
  (*doc->allocator->vtbl->free)(doc->allocator,node_00->element);
  (*doc->allocator->vtbl->free)(doc->allocator,node_00);
  node->was = node->tag;
  node->tag = pDVar1;
  node->type = StartTag;
  node->implicit = yes;
  (*doc->allocator->vtbl->free)(doc->allocator,node->element);
  ptVar2 = prvTidytmbstrdup(doc->allocator,pDVar1->name);
  node->element = ptVar2;
  return;
}

Assistant:

void TY_(CoerceNode)(TidyDocImpl* doc, Node *node, TidyTagId tid, Bool obsolete, Bool unexpected)
{
    const Dict* tag = TY_(LookupTagDef)(tid);
    Node* tmp = TY_(InferredTag)(doc, tag->id);

    if (obsolete)
        TY_(Report)(doc, node, tmp, OBSOLETE_ELEMENT);
    else if (unexpected)
        TY_(Report)(doc, node, tmp, REPLACING_UNEX_ELEMENT);
    else
        TY_(Report)(doc, node, tmp, REPLACING_ELEMENT);

    TidyDocFree(doc, tmp->element);
    TidyDocFree(doc, tmp);

    node->was = node->tag;
    node->tag = tag;
    node->type = StartTag;
    node->implicit = yes;
    TidyDocFree(doc, node->element);
    node->element = TY_(tmbstrdup)(doc->allocator, tag->name);
}